

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-bookmarks.cc
# Opt level: O0

void extract_bookmarks(vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>
                       *outlines,vector<int,_std::allocator<int>_> *numbers)

{
  bool bVar1;
  reference pvVar2;
  int local_d4;
  vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> local_c0 [40];
  vector<int,_std::allocator<int>_> local_98;
  QPDFOutlineObjectHelper local_80;
  QPDFOutlineObjectHelper *local_48;
  QPDFOutlineObjectHelper *outline;
  iterator __end1;
  iterator __begin1;
  vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> *__range1;
  int local_1c;
  vector<int,_std::allocator<int>_> *local_18;
  vector<int,_std::allocator<int>_> *numbers_local;
  vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> *outlines_local;
  
  local_18 = numbers;
  numbers_local = (vector<int,_std::allocator<int>_> *)outlines;
  if (style == st_lines) {
    __range1 = (vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> *)
               std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::size
                         (outlines);
    local_d4 = QIntC::to_int<unsigned_long>((unsigned_long *)&__range1);
    local_d4 = -local_d4;
  }
  else {
    local_d4 = 0;
  }
  local_1c = local_d4;
  std::vector<int,_std::allocator<int>_>::push_back(numbers,&local_1c);
  __end1 = std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::begin
                     (outlines);
  outline = (QPDFOutlineObjectHelper *)
            std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::end
                      (outlines);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<QPDFOutlineObjectHelper_*,_std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>
                                *)&outline);
    if (!bVar1) break;
    local_48 = __gnu_cxx::
               __normal_iterator<QPDFOutlineObjectHelper_*,_std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>
               ::operator*(&__end1);
    pvVar2 = std::vector<int,_std::allocator<int>_>::back(local_18);
    *pvVar2 = *pvVar2 + 1;
    QPDFOutlineObjectHelper::QPDFOutlineObjectHelper(&local_80,local_48);
    std::vector<int,_std::allocator<int>_>::vector(&local_98,local_18);
    show_bookmark_details(&local_80,&local_98);
    std::vector<int,_std::allocator<int>_>::~vector(&local_98);
    QPDFOutlineObjectHelper::~QPDFOutlineObjectHelper(&local_80);
    QPDFOutlineObjectHelper::getKids();
    extract_bookmarks(local_c0,local_18);
    std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::~vector
              (local_c0);
    __gnu_cxx::
    __normal_iterator<QPDFOutlineObjectHelper_*,_std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>
    ::operator++(&__end1);
  }
  std::vector<int,_std::allocator<int>_>::pop_back(local_18);
  return;
}

Assistant:

void
extract_bookmarks(std::vector<QPDFOutlineObjectHelper> outlines, std::vector<int>& numbers)
{
    // For style == st_numbers, numbers.at(n) contains the numerical label for the outline, so we
    // count up from 1.
    // For style == st_lines, numbers.at(n) == 0 indicates the last outline at level n, and we don't
    // otherwise care what the value is, so we count up to zero.
    numbers.push_back((style == st_lines) ? -QIntC::to_int(outlines.size()) : 0);
    for (auto& outline: outlines) {
        ++(numbers.back());
        show_bookmark_details(outline, numbers);
        extract_bookmarks(outline.getKids(), numbers);
    }
    numbers.pop_back();
}